

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileFeaturesCommand.cxx
# Opt level: O2

bool __thiscall
cmTargetCompileFeaturesCommand::HandleDirectContent
          (cmTargetCompileFeaturesCommand *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool param_3,bool param_4)

{
  pointer pbVar1;
  bool bVar2;
  pointer feature;
  string error;
  string local_50;
  
  feature = (content->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (content->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (feature == pbVar1) {
LAB_00208455:
      return feature == pbVar1;
    }
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    bVar2 = cmMakefile::AddRequiredTargetFeature
                      ((this->super_cmTargetPropCommandBase).super_cmCommand.Makefile,tgt,feature,
                       &local_50);
    if (!bVar2) {
      cmCommand::SetError((cmCommand *)this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      goto LAB_00208455;
    }
    std::__cxx11::string::~string((string *)&local_50);
    feature = feature + 1;
  } while( true );
}

Assistant:

bool cmTargetCompileFeaturesCommand::HandleDirectContent(
  cmTarget* tgt, const std::vector<std::string>& content, bool, bool)
{
  for (std::string const& it : content) {
    std::string error;
    if (!this->Makefile->AddRequiredTargetFeature(tgt, it, &error)) {
      this->SetError(error);
      return false; // Not (successfully) handled.
    }
  }
  return true; // Successfully handled.
}